

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

StructT * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStruct
          (StructT *__return_storage_ptr__,TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,
          FieldsT *fields)

{
  Struct local_38;
  FieldsT *local_20;
  FieldsT *fields_local;
  TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this_local;
  
  local_20 = fields;
  fields_local = (FieldsT *)this;
  this_local = (TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *)__return_storage_ptr__;
  Struct::Struct(&local_38,&fields->second);
  std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>::
  pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct,_true>
            (__return_storage_ptr__,&fields->first,&local_38);
  Struct::~Struct(&local_38);
  return __return_storage_ptr__;
}

Assistant:

StructT makeStruct(FieldsT& fields) {
    return {std::move(fields.first), Struct(std::move(fields.second))};
  }